

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

bool __thiscall Functions::findFunction(Functions *this,Function *function)

{
  bool bVar1;
  __type _Var2;
  size_type sVar3;
  reference ppFVar4;
  vector<Function_*,_std::allocator<Function_*>_> local_b0;
  undefined1 local_98 [8];
  string stackFID;
  string findFID;
  int local_3c;
  undefined1 local_38 [4];
  int i;
  Function *local_20;
  Function *function_local;
  Functions *this_local;
  
  if (function == (Function *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    local_20 = function;
    function_local = (Function *)this;
    getFunctionStack((vector<Function_*,_std::allocator<Function_*>_> *)local_38,this);
    bVar1 = std::vector<Function_*,_std::allocator<Function_*>_>::empty
                      ((vector<Function_*,_std::allocator<Function_*>_> *)local_38);
    std::vector<Function_*,_std::allocator<Function_*>_>::~vector
              ((vector<Function_*,_std::allocator<Function_*>_> *)local_38);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_3c = 0;
      while( true ) {
        getFunctionStack((vector<Function_*,_std::allocator<Function_*>_> *)
                         ((long)&findFID.field_2 + 8),this);
        sVar3 = std::vector<Function_*,_std::allocator<Function_*>_>::size
                          ((vector<Function_*,_std::allocator<Function_*>_> *)
                           ((long)&findFID.field_2 + 8));
        std::vector<Function_*,_std::allocator<Function_*>_>::~vector
                  ((vector<Function_*,_std::allocator<Function_*>_> *)((long)&findFID.field_2 + 8));
        if (sVar3 <= (ulong)(long)local_3c) break;
        (*(local_20->super_Statement)._vptr_Statement[3])
                  ((undefined1 *)((long)&stackFID.field_2 + 8));
        getFunctionStack(&local_b0,this);
        ppFVar4 = std::vector<Function_*,_std::allocator<Function_*>_>::operator[]
                            (&local_b0,(long)local_3c);
        (*((*ppFVar4)->super_Statement)._vptr_Statement[3])(local_98);
        std::vector<Function_*,_std::allocator<Function_*>_>::~vector(&local_b0);
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&stackFID.field_2 + 8),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_98);
        if (_Var2) {
          this_local._7_1_ = 1;
        }
        std::__cxx11::string::~string((string *)local_98);
        std::__cxx11::string::~string((string *)(stackFID.field_2._M_local_buf + 8));
        if (_Var2) goto LAB_001144e8;
        local_3c = local_3c + 1;
      }
    }
    this_local._7_1_ = 0;
  }
LAB_001144e8:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Functions::findFunction(Function *function) {
    if(function == nullptr) return false;
    if(!getFunctionStack().empty()) {
        for (int i = 0; i < getFunctionStack().size(); i++) {
            std::string findFID = function->id();
            std::string stackFID = getFunctionStack()[i]->id();
            if (findFID == stackFID) {
                return true;
            }
        }
    }
    return false;
}